

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O1

int fio_defer_perform_single_task_for_queue(fio_task_queue_s *queue)

{
  fio_lock_i fVar1;
  size_t sVar2;
  fio_defer_queue_block_s *pfVar3;
  int iVar4;
  fio_defer_queue_block_s *ptr;
  _func_void_void_ptr_void_ptr *p_Var5;
  void *pvVar6;
  void *pvVar7;
  fio_lock_i ret;
  timespec local_38;
  
  LOCK();
  fVar1 = queue->lock;
  queue->lock = '\x01';
  UNLOCK();
  while (fVar1 != '\0') {
    local_38.tv_sec = 0;
    local_38.tv_nsec = 1;
    nanosleep(&local_38,(timespec *)0x0);
    LOCK();
    fVar1 = queue->lock;
    queue->lock = '\x01';
    UNLOCK();
  }
  ptr = queue->reader;
  sVar2 = ptr->read;
  if ((ptr->write == sVar2) && (ptr->state == '\0')) {
    p_Var5 = (_func_void_void_ptr_void_ptr *)0x0;
    pvVar7 = (void *)0x0;
    pvVar6 = (void *)0x0;
  }
  else {
    ptr->read = sVar2 + 1;
    p_Var5 = ptr->tasks[sVar2].func;
    pvVar6 = ptr->tasks[sVar2].arg2;
    if (sVar2 + 1 == 0xa8) {
      ptr->read = 0;
      ptr->state = '\0';
    }
    pvVar7 = ptr->tasks[sVar2].arg1;
    if (ptr->write == ptr->read) {
      if (ptr->next == (fio_defer_queue_block_s *)0x0) {
        pfVar3 = &queue->static_queue;
        if ((ptr == pfVar3) || ((queue->static_queue).state != '\x02')) {
          ptr = (fio_defer_queue_block_s *)0x0;
        }
        else {
          queue->writer = pfVar3;
          queue->reader = pfVar3;
        }
        pfVar3 = queue->reader;
        pfVar3->write = 0;
        pfVar3->read = 0;
        pfVar3->state = '\0';
      }
      else {
        queue->reader = ptr->next;
      }
      goto LAB_001069d9;
    }
  }
  ptr = (fio_defer_queue_block_s *)0x0;
LAB_001069d9:
  if (ptr == &queue->static_queue) {
    (queue->static_queue).state = '\x02';
    (queue->static_queue).next = (fio_defer_queue_block_s *)0x0;
  }
  LOCK();
  fVar1 = queue->lock;
  queue->lock = '\0';
  UNLOCK();
  local_38.tv_sec = CONCAT71(local_38.tv_sec._1_7_,fVar1);
  if (ptr != (fio_defer_queue_block_s *)0x0 && ptr != &queue->static_queue) {
    fio_free(ptr);
  }
  if (p_Var5 == (_func_void_void_ptr_void_ptr *)0x0) {
    iVar4 = -1;
  }
  else {
    (*p_Var5)(pvVar7,pvVar6);
    iVar4 = 0;
  }
  return iVar4;
}

Assistant:

static inline int
fio_defer_perform_single_task_for_queue(fio_task_queue_s *queue) {
  fio_defer_task_s task = fio_defer_pop_task(queue);
  if (!task.func)
    return -1;
  task.func(task.arg1, task.arg2);
  return 0;
}